

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

void __thiscall
Problem::Problem(Problem *this,node *bidsArray,int numBids,int numCompanies,int numRegions)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  int *piVar6;
  size_type sVar7;
  vector<node,_std::allocator<node>_> *pvVar8;
  ulong uVar9;
  vector<node,_std::allocator<node>_> *local_9d38;
  int local_9ce4;
  int i_2;
  int cid;
  int i_1;
  node emptyNode;
  undefined1 auStack_78 [4];
  int i;
  pointer piStack_70;
  pointer local_68;
  vector<int,_std::allocator<int>_> local_48;
  int local_24;
  int local_20;
  int numRegions_local;
  int numCompanies_local;
  int numBids_local;
  node *bidsArray_local;
  Problem *this_local;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_24 = numRegions;
  local_20 = numCompanies;
  numRegions_local = numBids;
  _numCompanies_local = bidsArray;
  bidsArray_local = (node *)this;
  std::vector<int,_std::allocator<int>_>::vector(&local_48);
  State::State(&this->state,&local_48,0.0,0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_48);
  _auStack_78 = (pointer)0x0;
  piStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_78);
  State::State(&this->initialState,(vector<int,_std::allocator<int>_> *)auStack_78,0.0,0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_78);
  std::priority_queue<State,std::vector<State,std::allocator<State>>,CompareState>::
  priority_queue<std::vector<State,std::allocator<State>>,void>
            ((priority_queue<State,std::vector<State,std::allocator<State>>,CompareState> *)
             &this->validStateStore);
  uVar3 = (ulong)local_20;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar9 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar9);
  *puVar5 = uVar3;
  pvVar8 = (vector<node,_std::allocator<node>_> *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_9d38 = pvVar8;
    do {
      std::vector<node,_std::allocator<node>_>::vector(local_9d38);
      local_9d38 = local_9d38 + 1;
    } while (local_9d38 != pvVar8 + uVar3);
  }
  this->problemData = pvVar8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_20;
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar3);
  this->maxBids = piVar6;
  this->numCompanies = local_20;
  this->numRegions = local_24;
  this->validStoreSize = 100;
  for (emptyNode._40020_4_ = 0; (int)emptyNode._40020_4_ < local_20;
      emptyNode._40020_4_ = emptyNode._40020_4_ + 1) {
    cid = emptyNode._40020_4_;
    emptyNode.cid = 0;
    emptyNode._4_4_ = 0;
    emptyNode.price._0_4_ = 0;
    std::vector<node,_std::allocator<node>_>::push_back
              (this->problemData + (int)emptyNode._40020_4_,(value_type *)&cid);
  }
  for (i_2 = 0; i_2 < numRegions_local; i_2 = i_2 + 1) {
    std::vector<node,_std::allocator<node>_>::push_back
              (this->problemData + _numCompanies_local[i_2].cid,_numCompanies_local + i_2);
  }
  for (local_9ce4 = 0; local_9ce4 < local_20; local_9ce4 = local_9ce4 + 1) {
    sVar7 = std::vector<node,_std::allocator<node>_>::size(this->problemData + local_9ce4);
    this->maxBids[local_9ce4] = (int)sVar7;
  }
  return;
}

Assistant:

Problem::Problem(struct node bidsArray[], int numBids, int numCompanies, int numRegions) {
    // get problem data and company size from bidsArray

    this->problemData = new vector<struct node>[numCompanies];
    this->maxBids = new int[numCompanies];
    this->numCompanies = numCompanies;
    this->numRegions = numRegions;
    this->validStoreSize = 100;

    //Add no bid node for each company
    for (int i = 0; i < numCompanies; i++) {
        struct node emptyNode;
        emptyNode.cid = i;
        emptyNode.price = 0;
        emptyNode.norc = 0;
        this->problemData[i].push_back(emptyNode);
    }

    //Arrange input data
    for (int i = 0; i < numBids; i++) {
        int cid = bidsArray[i].cid;
        (this->problemData[cid]).push_back(bidsArray[i]);
    }

    //Initialize maxBids array for all companies
    for (int i = 0; i < numCompanies; i++) {
        this->maxBids[i] = (this->problemData[i]).size();
    }
}